

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall libtorrent::piece_picker::lock_piece(piece_picker *this,piece_index_t piece)

{
  uint uVar1;
  download_queue_t queue;
  iterator iVar2;
  
  uVar1 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + piece.m_val);
  queue.m_val = (byte)(uVar1 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar1 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  if (queue.m_val != '\x04') {
    iVar2 = find_dl_piece(this,queue,piece);
    if (iVar2._M_current !=
        *(pointer *)
         ((long)&(this->m_downloads).
                 super_array<libtorrent::aux::container_wrapper<libtorrent::piece_picker::downloading_piece,_int,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>,_4UL>
                 ._M_elems[queue.m_val].
                 super_vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
                 .
                 super__Vector_base<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
                 ._M_impl.super__Vector_impl_data + 8)) {
      if ((short)*(uint *)&(iVar2._M_current)->field_0x6 < 0) {
        *(uint *)&(iVar2._M_current)->field_0x6 =
             *(uint *)&(iVar2._M_current)->field_0x6 & 0xffff7fff;
        this->m_num_passed = this->m_num_passed + -1;
      }
      (iVar2._M_current)->field_0x9 = (iVar2._M_current)->field_0x9 | 0x80;
    }
  }
  return;
}

Assistant:

void piece_picker::lock_piece(piece_index_t const piece)
	{
		INVARIANT_CHECK;

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "lock_piece(" << piece << ")" << std::endl;
#endif

		auto const state = m_piece_map[piece].download_queue();
		if (state == piece_pos::piece_open) return;
		auto const i = find_dl_piece(state, piece);
		if (i == m_downloads[state].end()) return;

		TORRENT_ASSERT(i->passed_hash_check == false);
		if (i->passed_hash_check)
		{
			// it's not clear why this would happen,
			// but it seems reasonable to not break the
			// accounting over it.
			i->passed_hash_check = false;
			TORRENT_ASSERT(m_num_passed > 0);
			--m_num_passed;
		}

		// prevent this piece from being picked until it's restored
		i->locked = true;
	}